

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

CloseFrame *
uWS::WebSocketProtocol<false>::parseClosePayload
          (CloseFrame *__return_storage_ptr__,char *src,size_t length)

{
  bool bVar1;
  uint16_t uVar2;
  size_t length_00;
  uchar *s;
  
  if (length < 2) {
    length_00 = 0;
    s = (uchar *)0x0;
    uVar2 = 0;
LAB_00112c5b:
    __return_storage_ptr__->code = uVar2;
    *(undefined4 *)&__return_storage_ptr__->field_0x2 = 0;
    *(undefined2 *)&__return_storage_ptr__->field_0x6 = 0;
    __return_storage_ptr__->message = (char *)s;
    __return_storage_ptr__->length = length_00;
  }
  else {
    uVar2 = *(ushort *)src << 8 | *(ushort *)src >> 8;
    if (2 < (ushort)(uVar2 - 0x3ec) &&
        (0xbab < (ushort)(uVar2 - 0x3f4) && 0xf05f < (ushort)(uVar2 + 0xec78))) {
      length_00 = length - 2;
      s = (uchar *)(src + 2);
      bVar1 = isValidUtf8(s,length_00);
      if (bVar1) goto LAB_00112c5b;
    }
    *(undefined8 *)__return_storage_ptr__ = 0;
    __return_storage_ptr__->message = (char *)0x0;
    __return_storage_ptr__->length = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

static inline CloseFrame parseClosePayload(char *src, size_t length) {
        CloseFrame cf = {};
        if (length >= 2) {
            memcpy(&cf.code, src, 2);
            cf = {ntohs(cf.code), src + 2, length - 2};
            if (cf.code < 1000 || cf.code > 4999 || (cf.code > 1011 && cf.code < 4000) ||
                (cf.code >= 1004 && cf.code <= 1006) || !isValidUtf8((unsigned char *) cf.message, cf.length)) {
                return {};
            }
        }
        return cf;
    }